

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_40a165::Transaction::Transaction(Transaction *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Transaction_00271450;
  in_memory_store::in_memory_store(&this->store_);
  pstore::database::database<pstore::file::in_memory>
            (&(this->db_).super_database,&(this->store_).file_,true);
  (this->db_).super_database._vptr_database = (_func_int **)&PTR__mock_database_00271490;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->db_).gmock14_get_51.super_UntypedFunctionMockerBase);
  (this->db_).gmock14_get_51.super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_0026bca0;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->db_).gmock02_allocate_52.super_UntypedFunctionMockerBase);
  (this->db_).gmock02_allocate_52.super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_0026b4e8;
  (this->db_).super_database.vacuum_mode_ = disabled;
  return;
}

Assistant:

Transaction::Transaction ()
            : db_{store_.file ()} {
        db_.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
    }